

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O1

void __thiscall
backward::Printer::print_source_loc
          (Printer *this,ostream *os,char *indent,SourceLoc *source_loc,void *addr)

{
  size_t sVar1;
  ostream *poVar2;
  
  if (indent == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar1 = strlen(indent);
    std::__ostream_insert<char,std::char_traits<char>>(os,indent,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"Source \"",8);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(source_loc->filename)._M_dataplus._M_p,
                      (source_loc->filename)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\", line ",8);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", in ",5);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(source_loc->function)._M_dataplus._M_p,(source_loc->function)._M_string_length)
  ;
  if ((addr != (void *)0x0) && (this->address != false)) {
    std::__ostream_insert<char,std::char_traits<char>>(os," [",2);
    poVar2 = std::ostream::_M_insert<void_const*>(os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  return;
}

Assistant:

void print_source_loc(std::ostream &os, const char *indent,
                        const ResolvedTrace::SourceLoc &source_loc,
                        void *addr = nullptr) {
    os << indent << "Source \"" << source_loc.filename << "\", line "
       << source_loc.line << ", in " << source_loc.function;

    if (address && addr != nullptr) {
      os << " [" << addr << "]";
    }
    os << "\n";
  }